

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# return.c
# Opt level: O0

void contextsw(DLword fxnum,DLword bytenum,DLword flags)

{
  LispPTR LVar1;
  DLword *pDVar2;
  DLword *pDStack_20;
  DLword midpunt;
  DLword *freeptr;
  DLword *next68k;
  DLword flags_local;
  DLword bytenum_local;
  DLword fxnum_local;
  
  if ((flags & 1) == 0) {
    MachineState.pvar[-9] = MachineState.pvar[-9] & 0xfeff | 0x100;
  }
  else {
    error("contextswitch sets Incall");
  }
  MachineState.pvar[-6] =
       ((short)MachineState.currentpc - (short)MachineState.currentfunc) + bytenum;
  if ((flags & 2) == 0) {
    MachineState.csp = MachineState.csp + 2;
    *(LispPTR *)MachineState.csp = MachineState.tosvalue;
  }
  else {
    MachineState.csp = MachineState.csp + 2;
    *(uint *)MachineState.csp = (uint)fxnum;
  }
  MachineState.csp = MachineState.csp + 2;
  LVar1 = LAddrFromNative(MachineState.csp);
  MachineState.pvar[-5] = (DLword)LVar1;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((ulong)((long)MachineState.endofstack - (long)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("creating 0-long free stack block.");
  }
  LVar1 = LAddrFromNative(MachineState.pvar + -10);
  pDVar2 = NativeAligned2FromStackOffset
                     (*(DLword *)((ulong)(&InterfacePage->resetfxp + (int)(uint)fxnum) ^ 2));
  MachineState.pvar = pDVar2 + 10;
  *(short *)((ulong)(&InterfacePage->resetfxp + (int)(uint)fxnum) ^ 2) = (short)LVar1;
  pDVar2 = NativeAligned2FromStackOffset(MachineState.pvar[-5]);
  pDStack_20 = pDVar2;
  if (*(short *)((ulong)pDVar2 ^ 2) != -0x6000) {
    error("contextsw(): MP9316");
  }
  while (*(short *)((ulong)pDStack_20 ^ 2) == -0x6000) {
    MachineState.endofstack = pDStack_20 + (int)(uint)*(ushort *)((ulong)(pDStack_20 + 1) ^ 2);
    pDStack_20 = MachineState.endofstack;
  }
  if ((MachineState.pvar[-9] >> 10 & 1) == 0) {
    if ((MachineState.pvar[-9] >> 8 & 1) == 0) {
      MachineState.csp = pDVar2 + -2;
    }
    else {
      MachineState.pvar[-9] = MachineState.pvar[-9] & 0xfeff;
      MachineState.tosvalue = *(LispPTR *)(pDVar2 + -2);
      MachineState.csp = pDVar2 + -4;
    }
    MachineState.ivar =
         NativeAligned2FromStackOffset(*(DLword *)((ulong)(MachineState.pvar + -0xb) ^ 2));
    MachineState.currentfunc =
         (fnhead *)NativeAligned4FromLAddr(*(LispPTR *)(MachineState.pvar + -8));
    MachineState.currentpc =
         (ByteCode *)
         ((long)&(MachineState.currentfunc)->na + (long)(int)(uint)MachineState.pvar[-6]);
  }
  else {
    error("return to frame with incall bit ");
  }
  return;
}

Assistant:

void contextsw(DLword fxnum, DLword bytenum, DLword flags)

/* BYTEnum that you want increment PC
      after CONTEXTSW */
/* 0bit(MSB) ON: incall mode */
/* 1bit ON : call from OP_contextsw */
/* I don't know that it is the possible case that
       flags is 3 . */
{
  DLword *next68k;
  DLword *freeptr; /* point to STK to be FSB */

#ifdef TRACE
  printf("contextsw : %d \n", fxnum);
#endif

  if (fxnum != SubovFXP) {
    /* interrupt disable during executing [special] function
      invoked by contextsw(\KEYHANDLER,\RESETSTACK,FAULT)
     */
  }

  if (flags & 1) /* INCALL? */
    error("contextswitch sets Incall");
  else
    CURRENTFX->nopush = T;

  /* store PC */
  CURRENTFX->pc = (UNSIGNED)PC - (UNSIGNED)FuncObj + bytenum;

  /* TOS save */
  if (flags & 2) {
    PushStack(fxnum);
    CurrentStackPTR += 2;
  } else {
    PushCStack;
    CurrentStackPTR += 2;
  }

  CURRENTFX->nextblock = LOLOC(LAddrFromNative(CurrentStackPTR));

  /* FSB set */
  GETWORD(CurrentStackPTR) = STK_FSB_WORD;
  GETWORD(CurrentStackPTR + 1) = (((UNSIGNED)EndSTKP - (UNSIGNED)CurrentStackPTR) >> 1);
  if (0 == GETWORD(CurrentStackPTR + 1)) error("creating 0-long free stack block.");
#ifdef STACKCHECK
  if (EndSTKP < CurrentStackPTR) error("contextsw:Illegal ESP");
#endif

  Midpunt(fxnum); /* exchanging FX */

  next68k = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  if (GETWORD(next68k) != STK_FSB_WORD) error("contextsw(): MP9316");
  freeptr = next68k;

  /* Merging FSB area */
  while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

#ifdef DEBUG
  printf("contextsw:ESTKP set ");
  laddr(EndSTKP);
#endif

  if (CURRENTFX->incall) {
    error("return to frame with incall bit ");
  } else {
    if (CURRENTFX->nopush) {
#ifdef DEBUG
      printf("context:after:nopush \n");
#endif

      CURRENTFX->nopush = NIL;
      CurrentStackPTR = next68k - 2;
      TopOfStack = *((LispPTR *)CurrentStackPTR);
      CurrentStackPTR -= 2;

    } else {
#ifdef DEBUG
      printf("context:after:3 \n");
#endif
      CurrentStackPTR = next68k - 2 /*-1*/; /* CHanged by Hayata */
    }

#ifdef STACKCHECK
    CHECKFX;
    if (EndSTKP < CurrentStackPTR) error("contextsw:Illegal ESP");
#endif
    FastRetCALL;
    return;
  }

}